

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inter_basics.cpp
# Opt level: O0

void Interactor_Input_Event_Notify(Am_Object *event_window,Am_Input_Event *ev)

{
  bool bVar1;
  Am_Value *pAVar2;
  Am_Ptr value;
  Am_Wrapper *value_00;
  float local_84;
  float local_80;
  float this_priority;
  float run_also_priority;
  bool check_RUN_ALSO_list;
  bool check_RUN_ALSO_object;
  bool check_RUN_ALSO_list_or_object;
  bool doing_RUN_ALSO_only;
  Am_Value_List run_also_list;
  Am_Object run_also_object;
  Am_Value run_also_value;
  Am_Object inter;
  Am_Priority_List *pAStack_30;
  bool wants_event;
  Am_Priority_List *inter_list;
  Am_Value inter_list_value;
  Am_Input_Event *ev_local;
  Am_Object *event_window_local;
  
  inter_list_value.value = (anon_union_8_8_ea4c8939_for_value)ev;
  bVar1 = check_modal_windows(event_window,ev);
  if ((bVar1) || (bVar1 = check_deferred_events(inter_list_value.value,event_window), bVar1)) {
    return;
  }
  pAVar2 = Am_Object::Peek(event_window,0x124,0);
  Am_Value::Am_Value((Am_Value *)&inter_list,pAVar2);
  bVar1 = Am_Value::Valid((Am_Value *)&inter_list);
  if (bVar1) {
    value = Am_Value::operator_cast_to_void_((Am_Value *)&inter_list);
    pAStack_30 = Am_Priority_List::Narrow(value);
  }
  else {
    pAStack_30 = (Am_Priority_List *)0x0;
  }
  Am_Object::Am_Object((Am_Object *)&run_also_value.value);
  Am_Value::Am_Value((Am_Value *)&run_also_object);
  Am_Object::Am_Object((Am_Object *)&run_also_list.item);
  Am_Value_List::Am_Value_List((Am_Value_List *)&run_also_priority);
  this_priority._3_1_ = 0;
  this_priority._2_1_ = 0;
  this_priority._1_1_ = 0;
  this_priority._0_1_ = 0;
  local_80 = 0.0;
  if (pAStack_30 != (Am_Priority_List *)0x0) {
    Am_Priority_List::Note_Reference(pAStack_30);
    Am_Priority_List::Start(pAStack_30);
  }
  Am_Priority_List::Start(all_wins_inter_list);
LAB_0022ceb1:
  do {
    bVar1 = Am_Priority_List::Two_List_Get_Next
                      (all_wins_inter_list,pAStack_30,(Am_Object *)&run_also_value.value,&local_84);
    if (!bVar1) {
LAB_0022d156:
      if (pAStack_30 != (Am_Priority_List *)0x0) {
        Am_Priority_List::Release(pAStack_30);
      }
      Am_Value_List::~Am_Value_List((Am_Value_List *)&run_also_priority);
      Am_Object::~Am_Object((Am_Object *)&run_also_list.item);
      Am_Value::~Am_Value((Am_Value *)&run_also_object);
      Am_Object::~Am_Object((Am_Object *)&run_also_value.value);
      Am_Value::~Am_Value((Am_Value *)&inter_list);
      return;
    }
    bVar1 = Am_Object::Valid((Am_Object *)&run_also_value.value);
  } while (!bVar1);
  if ((((this_priority._3_1_ & 1) != 0) && ((this_priority._2_1_ & 1) == 0)) &&
     (local_84 < local_80)) goto LAB_0022d156;
  if ((this_priority._0_1_ & 1) != 0) {
    Am_Value_List::Start((Am_Value_List *)&run_also_priority);
  }
  if ((this_priority._3_1_ & 1) != 0) {
    if ((this_priority._2_1_ & 1) != 0) {
      if (((this_priority._1_1_ & 1) != 0) &&
         (bVar1 = Am_Object::operator==
                            ((Am_Object *)&run_also_value.value,(Am_Object *)&run_also_list.item),
         bVar1)) goto LAB_0022cff6;
      if ((this_priority._0_1_ & 1) != 0) {
        value_00 = Am_Object::operator_cast_to_Am_Wrapper_((Am_Object *)&run_also_value.value);
        bVar1 = Am_Value_List::Member((Am_Value_List *)&run_also_priority,value_00);
        if (bVar1) goto LAB_0022cff6;
      }
    }
    if ((this_priority._2_1_ & 1) != 0) goto LAB_0022ceb1;
    pAVar2 = Am_Object::Get((Am_Object *)&run_also_value.value,0x11c,0);
    bVar1 = Am_Value::Valid(pAVar2);
    if (!bVar1) goto LAB_0022ceb1;
  }
LAB_0022cff6:
  bVar1 = inter_is_go_for_user_and_event((Am_Object *)&run_also_value.value,inter_list_value.value);
  if ((bVar1) &&
     (bVar1 = Inter_Check_Go((Am_Object *)&run_also_value.value,inter_list_value.value,event_window)
     , bVar1)) {
    bVar1 = Am_Object::Valid((Am_Object *)&run_also_value.value);
    if (bVar1) {
      pAVar2 = Am_Object::Peek((Am_Object *)&run_also_value.value,0x11c,0);
      Am_Value::operator=((Am_Value *)&run_also_object,pAVar2);
      bVar1 = Am_Value::Valid((Am_Value *)&run_also_object);
      if (bVar1) {
        bVar1 = Am_Value_List::Test((Am_Value *)&run_also_object);
        if (bVar1) {
          Am_Value_List::operator=((Am_Value_List *)&run_also_priority,(Am_Value *)&run_also_object)
          ;
          this_priority._3_1_ = 1;
          local_80 = local_84;
          this_priority._0_1_ = 1;
          this_priority._2_1_ = 1;
        }
        else if ((short)run_also_object.data == -0x5fff) {
          Am_Object::operator=((Am_Object *)&run_also_list.item,(Am_Value *)&run_also_object);
          this_priority._3_1_ = 1;
          local_80 = local_84;
          this_priority._1_1_ = 1;
          this_priority._2_1_ = 1;
        }
      }
      else {
        this_priority._3_1_ = 1;
        local_80 = local_84;
      }
    }
    else {
      this_priority._3_1_ = 1;
      local_80 = local_84;
    }
  }
  goto LAB_0022ceb1;
}

Assistant:

static void
Interactor_Input_Event_Notify(Am_Object event_window, Am_Input_Event *ev)
{
  //first check if modal window
  if (check_modal_windows(event_window, ev))
    return;

  //now check if a deferred interactor wants this event
  if (check_deferred_events(ev, event_window)) {
    return;
  }

#ifdef DEBUG
  int was_inprogress =
      event_window.Get(Am_OBJECT_IN_PROGRESS, Am_RETURN_ZERO_ON_ERROR);
  if (was_inprogress & 2) {
    std::cerr << "** Processing events for window " << event_window
              << " but crashed last time, so skipping it.\n"
              << std::flush;
    return; //skip this object
  } else
    event_window.Set(Am_OBJECT_IN_PROGRESS, 2, Am_OK_IF_NOT_THERE);
#endif

  Am_Value inter_list_value = event_window.Peek(Am_INTER_LIST);
  Am_Priority_List *inter_list;
  bool wants_event;

  if (inter_list_value.Valid()) {
    Am_INTER_TRACE_PRINT(Am_INTER_TRACE_PRIORITIES,
                         "----Interactors for window " << event_window);
    inter_list = Am_Priority_List::Narrow(inter_list_value);
  } else {
    Am_INTER_TRACE_PRINT(Am_INTER_TRACE_PRIORITIES,
                         "----NO Interactors for window " << event_window);
    // no interactor list, still have to check global ones so don't exit
    inter_list = nullptr;
  }

  // process all the interactors in inter_list in priority order

  Am_Object inter;
  Am_Value run_also_value;
  Am_Object run_also_object;
  Am_Value_List run_also_list;
  bool doing_RUN_ALSO_only = false; //true if found an inter w/run_also
  bool check_RUN_ALSO_list_or_object = false;
  bool check_RUN_ALSO_object = false;
  bool check_RUN_ALSO_list = false;
  float run_also_priority = 0.0f;
  float this_priority;

  if (inter_list) {
    inter_list->Note_Reference();
    inter_list->Start();
  }
  all_wins_inter_list->Start();

  //std::cout <<"\nGlobal list: " << *all_wins_inter_list << endl
  //  << "List of " << event_window << " = " << *inter_list <<std::endl <<std::flush;

  while (all_wins_inter_list->Two_List_Get_Next(inter_list, inter,
                                                this_priority)) {
    //go through inter_list and all_wins_inter_list in parallel,
    //always getting the next priority inter from each

    // std::cout << "-<.> processing " << inter << " doing_RUN_ALSO_only "
    //      << doing_RUN_ALSO_only << " check_RUN_ALSO_list_or_object "
    //      << check_RUN_ALSO_list_or_object << " run_also_object= "
    //	  << run_also_object << " run_also_list " << run_also_list
    //	  <<std::endl <<std::flush;

    // Sometimes the window gets destroyed and all these interactors are
    // destroyed as well.  Must check to make sure interactors are okay.
    if (!inter.Valid())
      continue;

    if (doing_RUN_ALSO_only &&
        !check_RUN_ALSO_list_or_object) { // then found a regular inter, stop when priority is lower than
      // run_also_priority
      if (this_priority < run_also_priority)
        break; // then done.
    }          // end if (doing_RUN_ALSO_only)

    // std::cout << "__check " << inter << " doing run also=" << doing_RUN_ALSO_only
    //   << " inter runalso=" << (bool)inter.Get(Am_RUN_ALSO) <<std::endl <<std::flush;

    if (check_RUN_ALSO_list)
      run_also_list.Start();

    if ((!doing_RUN_ALSO_only ||
         (check_RUN_ALSO_list_or_object &&
              // if the run_also object is set then inter must be that object
              ((check_RUN_ALSO_object && inter == run_also_object) ||
          // if the run_also list is set then inter must be member of list
          (check_RUN_ALSO_list && run_also_list.Member(inter)))) ||
         //inter itself is a run_also
         (!check_RUN_ALSO_list_or_object && inter.Get(Am_RUN_ALSO).Valid())) &&
        // supports multiple users
        inter_is_go_for_user_and_event(inter, ev)) {
      //--> The actual running of the Interactor is here <--//
      wants_event = Inter_Check_Go(inter, ev, event_window);

      if (wants_event) {
        // Found one to run.  If it is not a RUN_ALSO_only, then only
        // run the RUN_ALSO interactors of the same priority level.
        // If it is a RUN_ALSO, then just keep going.
        // Be sure to fetch Am_RUN_ALSO again after Inter_Check_Go in
        // case changed by the running.
        if (inter.Valid()) {
          //inter might be destroyed while running
          run_also_value = inter.Peek(Am_RUN_ALSO);
          if (!run_also_value.Valid()) {
            //when Am_RUN_ALSO is not valid, then only run other
            // RUN_ALSO interactors.
            doing_RUN_ALSO_only = true;
            run_also_priority = this_priority;
          } else { //valid, see if object or list or ==true
            if (Am_Value_List::Test(run_also_value)) {
              run_also_list = run_also_value;
              doing_RUN_ALSO_only = true;
              run_also_priority = this_priority;
              check_RUN_ALSO_list = true;
              check_RUN_ALSO_list_or_object = true;
            } else if (run_also_value.type == Am_OBJECT) {
              run_also_object = run_also_value;
              doing_RUN_ALSO_only = true;
              run_also_priority = this_priority;
              check_RUN_ALSO_object = true;
              check_RUN_ALSO_list_or_object = true;
            }
            //else must be ==true, so continue to run other
            //interactors (leave doing_RUN_ALSO_only as false)
          }
        } else {
          // inter destroyed while running, but still only run other
          // run_also interactors.
          doing_RUN_ALSO_only = true;
          run_also_priority = this_priority;
        }
      }
    }
  }
  if (inter_list)
    inter_list->Release();
#ifdef DEBUG
  if (event_window.Valid()) //may not be valid while destroying window
    event_window.Set(Am_OBJECT_IN_PROGRESS, 0, Am_OK_IF_NOT_THERE);
#endif
}